

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testClassification.cpp
# Opt level: O2

void anon_unknown.dwarf_7f8b::testClass
               (half h,bool finite,bool normalized,bool denormalized,bool zero,bool nan,
               bool infinity,bool negative)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  ushort uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  char *__assertion;
  ushort uVar6;
  bool bVar7;
  bool bVar8;
  
  lVar1 = std::cout;
  uVar5 = CONCAT62(in_register_0000003a,h._h);
  *(undefined8 *)(printBits + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 8;
  poVar3 = (ostream *)operator<<((ostream *)&std::cout,(half *)(uVar5 & 0xffffffff));
  std::operator<<(poVar3,"    ");
  printBits((ostream *)&std::cout,(half *)(uVar5 & 0xffffffff));
  std::operator<<((ostream *)&std::cout,"    ");
  uVar4 = h._h & 0x7c00;
  if (uVar4 != 0x7c00) {
    std::operator<<((ostream *)&std::cout,"finite ");
  }
  uVar2 = (uint)(uVar5 >> 10) & 0x1f;
  if (((h._h & 0x7c00) != 0) && (uVar2 != 0x1f)) {
    std::operator<<((ostream *)&std::cout,"normalized ");
  }
  bVar7 = (h._h & 0x3ff) != 0;
  if (bVar7 && uVar4 == 0) {
    std::operator<<((ostream *)&std::cout,"denormalized ");
  }
  uVar6 = h._h & 0x7fff;
  if (uVar6 == 0) {
    std::operator<<((ostream *)&std::cout,"zero ");
  }
  bVar8 = (h._h & 0x3ff) != 0;
  if (uVar4 == 0x7c00 && bVar8) {
    std::operator<<((ostream *)&std::cout,"nan ");
  }
  if (uVar6 == 0x7c00) {
    std::operator<<((ostream *)&std::cout,"infinity ");
  }
  if ((short)h._h < 0) {
    std::operator<<((ostream *)&std::cout,"negative ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if ((uVar4 != 0x7c00) == finite) {
    if (((h._h & 0x7c00) != 0 && (short)uVar2 != 0x1f) == normalized) {
      if ((bVar7 && uVar4 == 0) == denormalized) {
        if ((uVar6 == 0) == zero) {
          if ((uVar4 == 0x7c00 && bVar8) == nan) {
            if ((uVar6 == 0x7c00) == infinity) {
              if ((short)h._h < 0 == negative) {
                return;
              }
              __assertion = "h.isNegative() == negative";
              uVar2 = 0x46;
            }
            else {
              __assertion = "h.isInfinity() == infinity";
              uVar2 = 0x45;
            }
          }
          else {
            __assertion = "h.isNan() == nan";
            uVar2 = 0x44;
          }
        }
        else {
          __assertion = "h.isZero() == zero";
          uVar2 = 0x43;
        }
      }
      else {
        __assertion = "h.isDenormalized() == denormalized";
        uVar2 = 0x42;
      }
    }
    else {
      __assertion = "h.isNormalized() == normalized";
      uVar2 = 0x41;
    }
  }
  else {
    __assertion = "h.isFinite() == finite";
    uVar2 = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                ,uVar2,
                "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
               );
}

Assistant:

void
testClass (half h,
	   bool finite,
	   bool normalized,
	   bool denormalized,
	   bool zero,
	   bool nan,
	   bool infinity,
	   bool negative)
{
    cout.width (15);
    cout.precision (8);

    cout << h << "    ";
    printBits (cout, h);
    cout << "    ";

    if (h.isFinite())
	cout << "finite ";

    if (h.isNormalized())
	cout << "normalized ";

    if (h.isDenormalized())
	cout << "denormalized ";

    if (h.isZero())
	cout << "zero ";

    if (h.isNan())
	cout << "nan ";

    if (h.isInfinity())
	cout << "infinity ";

    if (h.isNegative())
	cout << "negative ";

    cout << endl;

    assert (h.isFinite() == finite);
    assert (h.isNormalized() == normalized);
    assert (h.isDenormalized() == denormalized);
    assert (h.isZero() == zero);
    assert (h.isNan() == nan);
    assert (h.isInfinity() == infinity);
    assert (h.isNegative() == negative);
}